

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow.c
# Opt level: O3

void borg_flow_spread(wchar_t depth,_Bool optimize,_Bool avoid,_Bool tunneling,wchar_t stair_idx,
                     _Bool sneak)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  short sVar4;
  short sVar5;
  int iVar6;
  chunk_conflict *pcVar7;
  _Bool _Var8;
  wchar_t wVar9;
  loc lVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  borg_grid *pbVar17;
  int iVar18;
  wchar_t wVar19;
  long lVar20;
  wchar_t wVar21;
  long lVar22;
  bool bVar23;
  uint local_80;
  char local_64;
  
  iVar12 = borg.c.y;
  iVar15 = borg.c.x;
  local_64 = optimize;
  if ((L'\xffffffff' < stair_idx) && (borg.trait[0x23] < 0xf)) {
    iVar12 = track_less.y[(uint)stair_idx];
    iVar15 = track_less.x[(uint)stair_idx];
    local_64 = '\0';
  }
  if (flow_head != flow_tail) {
    iVar18 = (int)avoidance;
    iVar6 = borg.trait[0x1b];
    local_80 = 0;
    do {
      bVar1 = borg_flow_x[flow_tail];
      bVar2 = borg_flow_y[flow_tail];
      flow_tail = flow_tail + L'\x01';
      if (flow_tail == L'؀') {
        flow_tail = L'\0';
      }
      bVar3 = borg_data_cost->data[bVar2][bVar1];
      uVar13 = bVar3 + 1;
      if (local_80 <= bVar3) {
        local_80 = uVar13;
        if (local_64 == '\0') {
          if (depth <= (int)(uint)bVar3) {
            flow_head = L'\0';
            flow_tail = L'\0';
            return;
          }
        }
        else {
          if (depth <= (int)(uint)bVar3) {
            flow_head = L'\0';
            flow_tail = L'\0';
            return;
          }
          if (borg_data_cost->data[iVar12][iVar15] <= bVar3) {
            flow_head = L'\0';
            flow_tail = L'\0';
            return;
          }
        }
      }
      lVar14 = 0;
      do {
        pcVar7 = cave;
        lVar22 = (long)ddx_ddd[lVar14] + (ulong)bVar1;
        lVar16 = (long)ddy_ddd[lVar14] + (ulong)bVar2;
        wVar21 = (wchar_t)lVar22;
        wVar19 = (wchar_t)lVar16;
        lVar10 = (loc)loc(wVar21,wVar19);
        _Var8 = square_in_bounds_fully(pcVar7,lVar10);
        wVar9 = flow_head;
        if ((_Var8) && (uVar13 < borg_data_cost->data[lVar16][lVar22])) {
          pbVar17 = borg_grids[lVar16] + lVar22;
          if ((iVar18 <= iVar6 && sneak) && (borg_desperate & 1U) == 0) {
            lVar20 = 0;
            do {
              pcVar7 = cave;
              sVar4 = ddx_ddd[lVar20];
              sVar5 = ddy_ddd[lVar20];
              lVar10 = (loc)loc((int)((long)wVar21 + (long)sVar4),(int)((long)wVar19 + (long)sVar5))
              ;
              _Var8 = square_in_bounds_fully(pcVar7,lVar10);
              if ((_Var8) &&
                 (wVar9 = flow_head,
                 borg_grids[(long)wVar19 + (long)sVar5][(long)wVar21 + (long)sVar4].kill != '\0'))
              goto LAB_00220a53;
              lVar20 = lVar20 + 1;
            } while (lVar20 != 8);
          }
          bVar3 = pbVar17->feat;
          wVar9 = flow_head;
          if ((((tunneling) || (bVar3 < 0xf || (byte)(bVar3 - 0x17) < 2)) && (bVar3 != 0x16)) &&
             (((uint)bVar3 != L'\x17' || (borg.trait[0x40] != 0)))) {
            if (avoid) {
              if (bVar3 != 0 || iVar6 < iVar18) {
LAB_002206fb:
                if (((pbVar17->kill == '\0') ||
                    ((((borg_desperate == false && (borg.lunal_mode == false)) &&
                      ((borg.munchkin_mode == false && (borg.trait[0x71] == 0)))) &&
                     (((iVar6 < iVar18 || (borg.trait[0x27] < 2)) || (4 < borg.trait[0x24])))))) &&
                   ((((borg.goal.shop < 0 || (_Var8 = feat_is_shop((uint)bVar3), !_Var8)) ||
                     ((ushort)pbVar17->store == borg.goal.shop)) ||
                    ((wVar19 == borg.c.y || (wVar9 = flow_head, wVar21 == borg.c.x)))))) {
                  wVar9 = flow_head;
                  if ((pbVar17->trap != true) || (iVar6 < iVar18 || pbVar17->glyph != false))
                  goto LAB_002207e8;
                  if (0x3b < borg.trait[0x1b]) {
                    if (borg.trait[0x36] < 0x1e) {
                      if (0x13 < borg.trait[0x23]) {
LAB_002208e7:
                        if (borg.trait[0x37] < 0x1e) {
                          if (0x13 < borg.trait[0x23]) {
LAB_002207e8:
                            if (borg_data_icky->data[lVar16][lVar22] == '\0') {
                              if ((((borg_data_know->data[lVar16][lVar22] == '\0') &&
                                   (borg_data_know->data[lVar16][lVar22] = '\x01',
                                   borg_desperate == false)) && (borg.lunal_mode == false)) &&
                                 ((borg.munchkin_mode == false && (borg_digging == false)))) {
                                wVar9 = borg_danger(wVar19,wVar21,L'\x01',true,false);
                                iVar11 = (int)avoidance;
                                if (borg.trait[0x24] == 0x32) {
                                  wVar19 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
                                }
                                else {
                                  wVar19 = (iVar11 * 3) / 10;
                                }
                                wVar21 = iVar11 * 2;
                                if (scaryguy_on_level == false) {
                                  wVar21 = wVar19;
                                }
                                if (((unique_on_level != 0) && (vault_on_level == true)) &&
                                   (borg.trait[0x24] == 0x32)) {
                                  wVar21 = iVar11 * 3;
                                }
                                wVar19 = iVar11 * 3;
                                if (scaryguy_on_level == false) {
                                  wVar19 = wVar21;
                                }
                                if (5 < borg.trait[0x23]) {
                                  wVar19 = wVar21;
                                }
                                if (borg.goal.ignoring != false) {
                                  wVar19 = iVar11 * 5;
                                }
                                wVar21 = iVar11 * 0x19;
                                if (borg_t - borg_began < 0x1389) {
                                  wVar21 = wVar19;
                                }
                                wVar19 = iVar11 * 100;
                                if (borg.trait[0x27] != 0) {
                                  wVar19 = wVar21;
                                }
                                if (borg.trait[0x23] == 0) {
                                  wVar19 = (iVar11 * 3) / 10;
                                }
                                if (wVar19 < wVar9) {
                                  borg_data_icky->data[lVar16][lVar22] = '\x01';
                                  wVar9 = flow_head;
                                  goto LAB_00220a53;
                                }
                              }
                              borg_data_cost->data[lVar16][lVar22] = (uint8_t)uVar13;
                              borg_flow_x[flow_head] = (uint8_t)lVar22;
                              wVar9 = flow_head + L'\x01';
                              if (wVar9 == L'؀') {
                                wVar9 = L'\0';
                              }
                              bVar23 = wVar9 == flow_tail;
                              borg_flow_y[flow_head] = (uint8_t)lVar16;
                              if (bVar23) {
                                wVar9 = flow_head;
                              }
                            }
                          }
                        }
                        else if ((0x2c < (uint)borg.trait[0x37]) || (9 < borg.trait[0x23]))
                        goto LAB_002207e8;
                      }
                    }
                    else if ((0x2c < (uint)borg.trait[0x36]) || (9 < borg.trait[0x23]))
                    goto LAB_002208e7;
                  }
                }
              }
            }
            else if ((borg_desperate != true || iVar6 < iVar18) || bVar3 != 0) goto LAB_002206fb;
          }
        }
LAB_00220a53:
        flow_head = wVar9;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 8);
    } while (flow_head != flow_tail);
  }
  flow_tail = L'\0';
  flow_head = L'\0';
  return;
}

Assistant:

void borg_flow_spread(int depth, bool optimize, bool avoid, bool tunneling,
    int stair_idx, bool sneak)
{
    int  i;
    int  n, o = 0;
    int  x1, y1;
    int  x, y;
    int  fear = 0;
    int  ii;
    int  yy, xx;
    bool bad_sneak = false;
    int  origin_y, origin_x;
    bool twitchy = false;

    /* Default starting points */
    origin_y = borg.c.y;
    origin_x = borg.c.x;

    /* Is the borg moving under boosted bravery? */
    if (avoidance > borg.trait[BI_CURHP])
        twitchy = true;

    /* Use the closest stair for calculation distance (cost) from the stair to
     * the goal */
    if (stair_idx >= 0 && borg.trait[BI_CLEVEL] < 15) {
        origin_y = track_less.y[stair_idx];
        origin_x = track_less.x[stair_idx];
        optimize = false;
    }

    /* Now process the queue */
    while (flow_head != flow_tail) {
        /* Extract the next entry */
        x1 = borg_flow_x[flow_tail];
        y1 = borg_flow_y[flow_tail];

        /* Circular queue -- dequeue the next entry */
        if (++flow_tail == AUTO_FLOW_MAX)
            flow_tail = 0;

        /* Cost (one per movement grid) */
        n = borg_data_cost->data[y1][x1] + 1;

        /* New depth */
        if (n > o) {
            /* Optimize (if requested) */
            if (optimize && (n > borg_data_cost->data[origin_y][origin_x]))
                break;

            /* Limit depth */
            if (n > depth)
                break;

            /* Save */
            o = n;
        }

        /* Queue the "children" */
        for (i = 0; i < 8; i++) {
            int old_head;

            borg_grid *ag;

            /* reset bad_sneak */
            bad_sneak = false;

            /* Neighbor grid */
            x = x1 + ddx_ddd[i];
            y = y1 + ddy_ddd[i];

            /* only on legal grids */
            if (!square_in_bounds_fully(cave, loc(x, y)))
                continue;

            /* Skip "reached" grids */
            if (borg_data_cost->data[y][x] <= n)
                continue;

            /* Access the grid */
            ag = &borg_grids[y][x];

            if (sneak && !borg_desperate && !twitchy) {
                /* Scan the neighbors */
                for (ii = 0; ii < 8; ii++) {
                    /* Neighbor grid */
                    xx = x + ddx_ddd[ii];
                    yy = y + ddy_ddd[ii];

                    /* only on legal grids */
                    if (!square_in_bounds_fully(cave, loc(xx, yy)))
                        continue;

                    /* Make sure no monster is on this grid, which is
                     * adjacent to the grid on which, I am thinking about
                     * stepping.
                     */
                    if (borg_grids[yy][xx].kill) {
                        bad_sneak = true;
                        break;
                    }
                }
            }
            /* The grid I am thinking about is adjacent to a monster */
            if (bad_sneak)
                continue;

            /* Avoid "wall" grids (not doors) unless tunneling*/
            /* HACK depends on FEAT order, kinda evil */
            if (!tunneling
                && (ag->feat >= FEAT_SECRET && ag->feat != FEAT_PASS_RUBBLE
                    && ag->feat != FEAT_LAVA))
                continue;

            /* Avoid "perma-wall" grids */
            if (ag->feat == FEAT_PERM)
                continue;

            /* Avoid "Lava" grids (for now) */
            if (ag->feat == FEAT_LAVA && !borg.trait[BI_IFIRE])
                continue;

            /* Avoid unknown grids (if requested or retreating)
             * unless twitchy.  In which case, explore it
             */
            if ((avoid || borg_desperate) && (ag->feat == FEAT_NONE)
                && !twitchy)
                continue;

            /* flowing into monsters */
            if ((ag->kill)) {
                /* Avoid if Desperate, lunal */
                if (borg_desperate || borg.lunal_mode || borg.munchkin_mode)
                    continue;

                /* Avoid if afraid */
                if (borg.trait[BI_ISAFRAID])
                    continue;

                /* Avoid if low level, unless twitchy */
                if (!twitchy && borg.trait[BI_FOOD] >= 2
                    && borg.trait[BI_MAXCLEVEL] < 5)
                    continue;
            }

            /* Avoid shop entry points if I am not heading to that shop */
            if (borg.goal.shop >= 0 && feat_is_shop(ag->feat)
                && (ag->store != borg.goal.shop) && y != borg.c.y
                && x != borg.c.x)
                continue;

            /* Avoid Traps if low level-- unless brave */
            if (ag->trap && !ag->glyph && !twitchy) {
                /* Do not disarm when you could end up dead */
                if (borg.trait[BI_CURHP] < 60)
                    continue;

                /* Do not disarm when clumsy */
                /* since traps can be physical or magical, gotta check both */
                if (borg.trait[BI_DISP] < 30 && borg.trait[BI_CLEVEL] < 20)
                    continue;
                if (borg.trait[BI_DISP] < 45 && borg.trait[BI_CLEVEL] < 10)
                    continue;
                if (borg.trait[BI_DISM] < 30 && borg.trait[BI_CLEVEL] < 20)
                    continue;
                if (borg.trait[BI_DISM] < 45 && borg.trait[BI_CLEVEL] < 10)
                    continue;

                /* NOTE:  Traps are tough to deal with as a low
                 * level character.  If any modifications are made above,
                 * then the same changes must be made to borg_flow_direct()
                 * and borg_flow_interesting()
                 */
            }

            /* Ignore "icky" grids */
            if (borg_data_icky->data[y][x])
                continue;

            /* Analyze every grid once */
            if (!borg_data_know->data[y][x]) {
                int p;

                /* Mark as known */
                borg_data_know->data[y][x] = true;

                if (!borg_desperate && !borg.lunal_mode && !borg.munchkin_mode
                    && !borg_digging) {
                    /* Get the danger */
                    p = borg_danger(y, x, 1, true, false);

                    /* Increase bravery */
                    if (borg.trait[BI_MAXCLEVEL] == 50)
                        fear = avoidance * 5 / 10;
                    if (borg.trait[BI_MAXCLEVEL] != 50)
                        fear = avoidance * 3 / 10;
                    if (scaryguy_on_level)
                        fear = avoidance * 2;
                    if (unique_on_level && vault_on_level
                        && borg.trait[BI_MAXCLEVEL] == 50)
                        fear = avoidance * 3;
                    if (scaryguy_on_level && borg.trait[BI_CLEVEL] <= 5)
                        fear = avoidance * 3;
                    if (borg.goal.ignoring)
                        fear = avoidance * 5;
                    if (borg_t - borg_began > 5000)
                        fear = avoidance * 25;
                    if (borg.trait[BI_FOOD] == 0)
                        fear = avoidance * 100;

                    /* Normal in town */
                    if (borg.trait[BI_CLEVEL] == 0)
                        fear = avoidance * 3 / 10;

                    /* Dangerous grid */
                    if (p > fear) {
                        /* Mark as icky */
                        borg_data_icky->data[y][x] = true;

                        /* Ignore this grid */
                        continue;
                    }
                }
            }

            /* Save the flow cost */
            borg_data_cost->data[y][x] = n;

            /* Enqueue that entry */
            borg_flow_x[flow_head] = x;
            borg_flow_y[flow_head] = y;

            /* Circular queue -- memorize head */
            old_head = flow_head;

            /* Circular queue -- insert with wrap */
            if (++flow_head == AUTO_FLOW_MAX)
                flow_head = 0;

            /* Circular queue -- handle overflow (badly) */
            if (flow_head == flow_tail)
                flow_head = old_head;
        }
    }

    /* Forget the flow info */
    flow_head = flow_tail = 0;
}